

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

void __thiscall
solitaire::Solitaire::throwExceptionOnInvalidTableauPileId(Solitaire *this,PileId *id)

{
  runtime_error *this_00;
  uint *puVar1;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  PileId *local_18;
  PileId *id_local;
  Solitaire *this_local;
  
  if (6 < id->t) {
    local_18 = id;
    id_local = (PileId *)this;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar1 = piles::PileId::operator_cast_to_unsigned_int_(id);
    std::__cxx11::to_string(&local_58,*puVar1);
    std::operator+(&local_38,"Cannot access tableau pile with id: ",&local_58);
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Solitaire::throwExceptionOnInvalidTableauPileId(const PileId id) const {
    if (id.t >= tableauPilesCount)
        throw std::runtime_error {
            "Cannot access tableau pile with id: " + std::to_string(id)
        };
}